

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O0

void __thiscall COLLADASaxFWL::DocumentProcessor::addCamera(DocumentProcessor *this,Camera *camera)

{
  value_type *in_RDI;
  vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_> *unaff_retaddr;
  
  std::vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addCamera( COLLADAFW::Camera* camera ) { mCameras.push_back(camera); }